

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_2,_3>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  long lVar1;
  Vector<float,_3> *in_RCX;
  Type in1;
  Type in0;
  Vector<float,_2> local_68;
  float local_60;
  undefined8 local_58;
  float local_4c [3];
  int local_40 [6];
  Matrix<float,_2,_3> local_28;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_58 = *(undefined8 *)(evalCtx->coords).m_data;
  }
  else {
    local_58 = 0x3f0000003f99999a;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_68.m_data = *(float (*) [2])(evalCtx->coords).m_data;
    local_60 = (evalCtx->coords).m_data[2];
  }
  else {
    local_68.m_data[0] = -0.2;
    local_68.m_data[1] = 0.5;
    local_60 = 0.8;
  }
  outerProduct<float,3,2>(&local_28,(MatrixCaseUtils *)&local_58,&local_68,in_RCX);
  local_4c[0] = local_28.m_data.m_data[0].m_data[0] + local_28.m_data.m_data[0].m_data[1];
  local_4c[1] = local_28.m_data.m_data[1].m_data[0] + local_28.m_data.m_data[1].m_data[1];
  local_4c[2] = local_28.m_data.m_data[2].m_data[0] + local_28.m_data.m_data[2].m_data[1];
  local_40[2] = 0;
  local_40[3] = 1;
  local_40[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[local_40[lVar1]] = *(float *)((long)&local_58 + lVar1 * 4 + 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}